

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *__ptr_00;
  int *pDesign;
  byte *__ptr_01;
  int *__ptr_02;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  Ndr_Data_t *p;
  Vec_Int_t *p_00;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  int Output;
  int in_stack_ffffffffffffff88;
  int local_74;
  Vec_Int_t *__ptr_03;
  Vec_Int_t *pVVar16;
  int local_3c;
  ulong local_38;
  
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 100;
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar4 = (int *)malloc(400);
  __ptr->pArray = piVar4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar5->pArray = piVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar6->pArray = piVar4;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 100;
  __ptr_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  __ptr_00->pArray = piVar4;
  if (vBuffer->nSize < 1) {
LAB_0039169d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (*vBuffer->pArray != 1) {
    __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0xeb,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
  }
  __ptr_03 = pVVar5;
  pVVar16 = pVVar6;
  if (2 < (uint)vBuffer->nSize) {
    lVar12 = 2;
    p_00 = (Vec_Int_t *)0x0;
    do {
      iVar10 = vBuffer->pArray[lVar12];
      if ((p_00 == (Vec_Int_t *)0x0) && (0xd < iVar10)) {
        pVVar15 = (Vec_Int_t *)0x0;
      }
      else {
        pVVar15 = pVVar3;
        switch(iVar10) {
        case 2:
          goto switchD_0039111a_caseD_2;
        case 3:
          break;
        case 4:
          pVVar15 = __ptr;
          break;
        case 5:
          pVVar15 = pVVar5;
          break;
        default:
          pVVar15 = p_00;
          iVar11 = iVar10;
          pVVar5 = __ptr_03;
          if (iVar10 - 6U < 8) {
            Vec_IntPush(pVVar6,iVar10);
            p_00 = pVVar6;
            pVVar15 = __ptr_00;
            iVar11 = __ptr_00->nSize;
            pVVar5 = __ptr_03;
          }
          Vec_IntPush(p_00,iVar11);
          __ptr_03 = pVVar5;
        }
      }
      lVar12 = lVar12 + 1;
      p_00 = pVVar15;
    } while (lVar12 < vBuffer->nSize);
  }
switchD_0039111a_caseD_2:
  local_74 = iVar10;
  pVVar5 = pVVar16;
  Vec_IntPush(pVVar16,-1);
  Vec_IntPush(pVVar16,__ptr_00->nSize);
  if (vBuffer->nSize < 2) goto LAB_0039169d;
  piVar4 = vBuffer->pArray;
  iVar11 = piVar4[1];
  pDesign = (int *)malloc(0x18);
  pDesign[1] = 0x10;
  __ptr_01 = (byte *)malloc(0x10);
  *(byte **)(pDesign + 2) = __ptr_01;
  __ptr_02 = (int *)malloc(0x100);
  *(int **)(pDesign + 4) = __ptr_02;
  __ptr_01[0] = 1;
  __ptr_01[1] = 7;
  *pDesign = 2;
  __ptr_02[1] = iVar11;
  *__ptr_02 = 2;
  if (iVar11 == 0) {
    __assert_fail("Name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x20d,"void *Ndr_Create(int)");
  }
  iVar11 = piVar4[1];
  __ptr_01[2] = 2;
  __ptr_01[3] = 7;
  lVar12 = 4;
  *pDesign = 4;
  __ptr_02[3] = iVar11;
  __ptr_02[2] = 2;
  *__ptr_02 = 4;
  uVar2 = pVVar3->nSize;
  if ((long)(int)uVar2 < 0xd) {
    uVar9 = 0x10;
    uVar1 = 0x10;
    if (0 < (int)uVar2) goto LAB_00391267;
  }
  else {
    uVar9 = 0x1c;
    if (0x1c < uVar2) {
      uVar9 = uVar2;
    }
    uVar1 = uVar9 + 4;
    pDesign[1] = uVar1;
    __ptr_01 = (byte *)realloc(__ptr_01,(ulong)uVar1);
    *(byte **)(pDesign + 2) = __ptr_01;
    __ptr_02 = (int *)realloc(__ptr_02,(ulong)(uVar9 * 4 + 0x10));
    *(int **)(pDesign + 4) = __ptr_02;
LAB_00391267:
    uVar9 = uVar1;
    piVar4 = pVVar3->pArray;
    lVar13 = 4;
    do {
      iVar10 = piVar4[lVar13 + -4];
      __ptr_01[lVar13] = 4;
      lVar12 = lVar13 + 1;
      __ptr_02[lVar13] = iVar10;
      uVar8 = lVar13 - 3;
      lVar13 = lVar12;
    } while (uVar8 < (ulong)(long)(int)uVar2);
    *pDesign = (int)lVar12;
  }
  iVar11 = (int)lVar12;
  local_74 = iVar10;
  if (__ptr_01[2] == 0) {
LAB_003916fa:
    __assert_fail("p->pHead[i]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
  }
  if (__ptr_01[2] < 4) {
    __ptr_02[2] = __ptr_02[2] + uVar2;
    if (*__ptr_01 == 0) goto LAB_003916fa;
    if (*__ptr_01 < 4) {
      *__ptr_02 = *__ptr_02 + uVar2;
      iVar14 = __ptr->nSize;
      uVar2 = iVar11 + iVar14;
      if ((int)uVar9 < (int)uVar2) {
        uVar1 = uVar9 * 2;
        if ((int)(uVar9 * 2) <= (int)uVar2) {
          uVar1 = uVar2;
        }
        local_38 = (ulong)uVar1;
        pDesign[1] = uVar1;
        __ptr_01 = (byte *)realloc(__ptr_01,local_38);
        *(byte **)(pDesign + 2) = __ptr_01;
        __ptr_02 = (int *)realloc(__ptr_02,(ulong)(uint)((int)local_38 << 2));
        *(int **)(pDesign + 4) = __ptr_02;
      }
      if (0 < iVar14) {
        lVar12 = 0;
        do {
          iVar10 = __ptr->pArray[lVar12];
          __ptr_01[lVar12 + iVar11] = 5;
          __ptr_02[iVar11 + lVar12] = iVar10;
          lVar12 = lVar12 + 1;
          iVar14 = __ptr->nSize;
        } while (lVar12 < iVar14);
        iVar11 = iVar11 + (int)lVar12;
        *pDesign = iVar11;
        __ptr_01 = *(byte **)(pDesign + 2);
      }
      local_74 = iVar10;
      if (__ptr_01[2] == 0) goto LAB_003916fa;
      if (__ptr_01[2] < 4) {
        piVar4 = *(int **)(pDesign + 4);
        piVar4[2] = piVar4[2] + iVar14;
        if (*__ptr_01 == 0) goto LAB_003916fa;
        if (*__ptr_01 < 4) {
          *piVar4 = *piVar4 + __ptr->nSize;
          iVar14 = __ptr_03->nSize;
          iVar11 = iVar11 + iVar14;
          if (pDesign[1] < iVar11) {
            iVar14 = pDesign[1] * 2;
            if (iVar14 <= iVar11) {
              iVar14 = iVar11;
            }
            pDesign[1] = iVar14;
            __ptr_01 = (byte *)realloc(__ptr_01,(long)iVar14);
            *(byte **)(pDesign + 2) = __ptr_01;
            piVar4 = (int *)realloc(piVar4,(long)(iVar14 << 2));
            *(int **)(pDesign + 4) = piVar4;
            iVar14 = __ptr_03->nSize;
          }
          if (iVar14 < 1) {
            iVar11 = 0;
          }
          else {
            lVar12 = 0;
            iVar11 = 0;
            do {
              iVar10 = __ptr_03->pArray[lVar12];
              pcVar7 = Abc_NamStr(pNames,iVar10);
              if ((*pcVar7 == 't') && (pcVar7[1] == '_')) {
                iVar14 = *pDesign;
                __ptr_01[iVar14] = 10;
                piVar4 = *(int **)(pDesign + 4);
                *pDesign = iVar14 + 1;
                piVar4[iVar14] = iVar10;
                iVar11 = iVar11 + 1;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < __ptr_03->nSize);
          }
          local_74 = iVar10;
          if (__ptr_01[2] == 0) goto LAB_003916fa;
          if (__ptr_01[2] < 4) {
            piVar4[2] = piVar4[2] + iVar11;
            if (*__ptr_01 == 0) goto LAB_003916fa;
            if (*__ptr_01 < 4) {
              *piVar4 = *piVar4 + iVar11;
              pVVar6 = pVVar3;
              pVVar16 = __ptr_00;
              if (0 < pVVar3->nSize) {
                lVar12 = 0;
                do {
                  local_74 = pVVar3->pArray[lVar12];
                  Ndr_AddObject(pDesign,0x102,3,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                                (int)__ptr_03,&pVVar5->nCap,(int)__ptr,&pVVar6->nCap,(char *)pVVar16
                               );
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pVVar3->nSize);
              }
              local_74 = Abc_NamStrFind(pNames,"1\'b0");
              if (local_74 != 0) {
                Ndr_AddObject(pDesign,0x102,7,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                              (int)__ptr_03,&pVVar5->nCap,(int)__ptr,&pVVar6->nCap,(char *)pVVar16);
              }
              local_74 = Abc_NamStrFind(pNames,"1\'b1");
              if (local_74 != 0) {
                Ndr_AddObject(pDesign,0x102,8,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                              (int)__ptr_03,&pVVar5->nCap,(int)__ptr,&pVVar6->nCap,(char *)pVVar16);
              }
              iVar10 = pVVar5->nSize;
              if (1 < (long)iVar10) {
                piVar4 = pVVar5->pArray;
                uVar8 = 3;
                do {
                  iVar11 = piVar4[uVar8 - 3];
                  if (0 < iVar11) {
                    uVar2 = piVar4[uVar8 - 2];
                    if (((int)uVar2 < 0) || (__ptr_00->nSize <= (int)uVar2)) goto LAB_0039169d;
                    local_3c = __ptr_00->pArray[uVar2];
                    if ((ulong)(long)iVar10 <= uVar8) goto LAB_0039169d;
                    if ((uint)__ptr_00->nSize <= uVar2 + 1) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                    }
                    if (7 < iVar11 - 6U) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                                    ,0x56,"int Acb_Type2Oper(int)");
                    }
                    Ndr_AddObject(pDesign,0x102,iVar11 + 5,~uVar2 + piVar4[uVar8],
                                  (int)__ptr_00->pArray + (uVar2 + 1) * 4,(int)&local_3c,
                                  in_stack_ffffffffffffff88,(int)__ptr_03,&pVVar5->nCap,(int)__ptr,
                                  &pVVar6->nCap,(char *)pVVar16);
                  }
                  iVar11 = (int)uVar8;
                  uVar8 = uVar8 + 2;
                } while (iVar11 < iVar10);
              }
              if (0 < __ptr->nSize) {
                lVar12 = 0;
                pVVar3 = __ptr;
                do {
                  local_74 = __ptr->pArray[lVar12];
                  Ndr_AddObject(pDesign,0x102,4,1,(int)&local_74,(int)&local_74,
                                in_stack_ffffffffffffff88,(int)__ptr_03,&pVVar5->nCap,(int)pVVar3,
                                &pVVar6->nCap,(char *)pVVar16);
                  lVar12 = lVar12 + 1;
                } while (lVar12 < __ptr->nSize);
              }
              if (pVVar6->pArray != (int *)0x0) {
                free(pVVar6->pArray);
              }
              free(pVVar6);
              if (__ptr->pArray != (int *)0x0) {
                free(__ptr->pArray);
              }
              free(__ptr);
              if (__ptr_03->pArray != (int *)0x0) {
                free(__ptr_03->pArray);
              }
              free(__ptr_03);
              if (pVVar5->pArray != (int *)0x0) {
                free(pVVar5->pArray);
              }
              free(pVVar5);
              if (__ptr_00->pArray != (int *)0x0) {
                free(__ptr_00->pArray);
              }
              free(__ptr_00);
              return pDesign;
            }
          }
        }
      }
    }
  }
  __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            //char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            //if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
            //    i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = (Ndr_Data_t *)Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}